

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTPNStmObjectBase::add_superclass(CTPNStmObjectBase *this,CTcSymbol *sym)

{
  CTPNSuperclass *this_00;
  CTPNSuperclass *sc;
  long in_RDI;
  CTcSymbol *in_stack_ffffffffffffffc8;
  
  this_00 = (CTPNSuperclass *)(in_RDI + 0x60);
  sc = (CTPNSuperclass *)CTcPrsAllocObj::operator_new(0x2c1e96);
  CTPNSuperclass::CTPNSuperclass(this_00,in_stack_ffffffffffffffc8);
  CTPNSuperclassList::append((CTPNSuperclassList *)this_00,sc);
  return;
}

Assistant:

void CTPNStmObjectBase::add_superclass(CTcSymbol *sym)
{
    /* add a new superclass entry to my list */
    sclist_.append(new CTPNSuperclass(sym));
}